

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

double PAL_wcstod(char16_t *nptr,char16_t **endptr)

{
  int iVar1;
  BOOL BVar2;
  LPWSTR local_50;
  LPSTR ScanStop;
  char16_t **ppcStack_40;
  UINT Length;
  LPWSTR lpEndOfExpression;
  LPWSTR lpStartOfExpression;
  LPSTR lpStringRep;
  double RetVal;
  char16_t **endptr_local;
  char16_t *nptr_local;
  
  lpStringRep = (LPSTR)0x0;
  lpStartOfExpression = (LPWSTR)0x0;
  ppcStack_40 = (char16_t **)0x0;
  ScanStop._4_4_ = 0;
  lpEndOfExpression = nptr;
  RetVal = (double)endptr;
  endptr_local = (char16_t **)nptr;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (nptr == (char16_t *)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    nptr_local = (char16_t *)0x0;
  }
  else {
    while (iVar1 = PAL_iswspace(*lpEndOfExpression), iVar1 != 0) {
      lpEndOfExpression = lpEndOfExpression + 1;
    }
    ppcStack_40 = (char16_t **)lpEndOfExpression;
    while ((*(WCHAR *)ppcStack_40 != L'\0' &&
           (BVar2 = MISC_CRT_WCSTOD_IsValidCharacter(*(WCHAR *)ppcStack_40), BVar2 != 0))) {
      ppcStack_40 = (char16_t **)((long)ppcStack_40 + 2);
    }
    if (ppcStack_40 == (char16_t **)lpEndOfExpression) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      ppcStack_40 = endptr_local;
    }
    else {
      ScanStop._4_4_ = (uint)((long)ppcStack_40 - (long)lpEndOfExpression >> 1);
      lpStartOfExpression = (LPWSTR)PAL_malloc((ulong)(ScanStop._4_4_ + 1));
      if (lpStartOfExpression == (LPWSTR)0x0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        ppcStack_40 = endptr_local;
      }
      else {
        iVar1 = WideCharToMultiByte(0,0,lpEndOfExpression,ScanStop._4_4_,(LPSTR)lpStartOfExpression,
                                    ScanStop._4_4_ + 1,(LPCSTR)0x0,(LPBOOL)0x0);
        if (iVar1 == 0) {
          fprintf(_stderr,"] %s %s:%d","PAL_wcstod",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/wchar.cpp"
                  ,0x6b1);
          fprintf(_stderr,"Wide char to multibyte conversion failed.\n");
          ppcStack_40 = endptr_local;
        }
        else {
          local_50 = (LPWSTR)0x0;
          *(undefined1 *)((long)lpStartOfExpression + (ulong)ScanStop._4_4_) = 0;
          lpStringRep = (LPSTR)strtod((char *)lpStartOfExpression,(char **)&local_50);
          if ((((double)lpStringRep == 0.0) && (!NAN((double)lpStringRep))) &&
             (local_50 == lpStartOfExpression)) {
            fprintf(_stderr,"] %s %s:%d","PAL_wcstod",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/wchar.cpp"
                    ,0x6ab);
            fprintf(_stderr,"An error occurred in the conversion.\n");
            ppcStack_40 = endptr_local;
          }
        }
      }
    }
    if (RetVal != 0.0) {
      *(char16_t ***)RetVal = ppcStack_40;
    }
    PAL_free(lpStartOfExpression);
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    nptr_local = (char16_t *)lpStringRep;
  }
  return (double)nptr_local;
}

Assistant:

double
__cdecl
PAL_wcstod( const char16_t * nptr, char16_t **endptr )
{
    double RetVal = 0.0;
    LPSTR  lpStringRep = NULL;
    LPWSTR lpStartOfExpression = (LPWSTR)nptr;
    LPWSTR lpEndOfExpression = NULL;
    UINT Length = 0;

    PERF_ENTRY(wcstod);
    ENTRY( "wcstod( %p (%S), %p (%S) )\n", nptr, nptr, endptr , endptr );

    if ( !nptr )
    {
        ERROR( "nptr is invalid.\n" );
        LOGEXIT( "wcstod returning 0.0\n" );
        PERF_EXIT(wcstod);
        return 0.0;
    }

    /* Eat white space. */
    while ( PAL_iswspace( *lpStartOfExpression ) )
    {
        lpStartOfExpression++;
    }

    /* Get the end of the expression. */
    lpEndOfExpression = lpStartOfExpression;
    while ( *lpEndOfExpression )
    {
        if ( !MISC_CRT_WCSTOD_IsValidCharacter( *lpEndOfExpression ) )
        {
            break;
        }
        lpEndOfExpression++;
    }

    if ( lpEndOfExpression != lpStartOfExpression )
    {
        Length = lpEndOfExpression - lpStartOfExpression;
        lpStringRep = (LPSTR)PAL_malloc( Length + 1);

        if ( lpStringRep )
        {
            if ( WideCharToMultiByte( CP_ACP, 0, lpStartOfExpression, Length,
                                      lpStringRep, Length + 1 ,
                                      NULL, 0 ) != 0 )
            {
                LPSTR ScanStop = NULL;
                lpStringRep[Length]= 0;
                RetVal = strtod( lpStringRep, &ScanStop );

                /* See if strtod failed. */
                if ( RetVal == 0.0 && ScanStop == lpStringRep )
                {
                    ASSERT( "An error occurred in the conversion.\n" );
                    lpEndOfExpression = (LPWSTR)nptr;
                }
            }
            else
            {
                ASSERT( "Wide char to multibyte conversion failed.\n" );
                lpEndOfExpression = (LPWSTR)nptr;
            }
        }
        else
        {
            ERROR( "Not enough memory.\n" );
            lpEndOfExpression = (LPWSTR)nptr;
        }
    }
    else
    {
        ERROR( "Malformed expression.\n" );
        lpEndOfExpression = (LPWSTR)nptr;
    }

    /* Set the stop scan character. */
    if ( endptr != NULL )
    {
        *endptr = lpEndOfExpression;
    }

    PAL_free( lpStringRep );
    LOGEXIT( "wcstod returning %f.\n", RetVal );
    PERF_EXIT(wcstod);
    return RetVal;
}